

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall
ktx::DiffComplex<KTXanimData>::printText
          (DiffComplex<KTXanimData> *this,size_t index,PrintIndent *out,char *prefix)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char *local_48;
  string local_40;
  
  local_48 = prefix;
  if (*(int *)((long)&this->values[index].super__Optional_base<KTXanimData,_false,_false>._M_payload
                      .super__Optional_payload<KTXanimData,_true,_false,_false>.
                      super__Optional_payload_base<KTXanimData>._M_payload + 0x10) == 0xc) {
    uVar1 = 0;
    PrintIndent::operator()(out,0,(char (*) [2])0x1cebe2);
    local_40._M_dataplus._M_p._0_4_ = 0;
    if (3 < *(uint *)((long)&this->values[index].super__Optional_base<KTXanimData,_false,_false>.
                             _M_payload.super__Optional_payload<KTXanimData,_true,_false,_false>.
                             super__Optional_payload_base<KTXanimData>._M_payload + 0x10)) {
      local_40._M_dataplus._M_p._0_4_ =
           *(undefined4 *)
            *(char **)((long)&this->values[index].super__Optional_base<KTXanimData,_false,_false>.
                              _M_payload.super__Optional_payload<KTXanimData,_true,_false,_false>.
                              super__Optional_payload_base<KTXanimData>._M_payload._M_value.
                              super_KVEntry + 8);
    }
    PrintIndent::operator()(out,0,(char (*) [20])"{}    duration: {}\n",&local_48,(uint *)&local_40)
    ;
    if (7 < *(uint *)((long)&this->values[index].super__Optional_base<KTXanimData,_false,_false>.
                             _M_payload.super__Optional_payload<KTXanimData,_true,_false,_false>.
                             super__Optional_payload_base<KTXanimData>._M_payload + 0x10)) {
      uVar1 = *(undefined4 *)
               (*(char **)((long)&this->values[index].
                                  super__Optional_base<KTXanimData,_false,_false>._M_payload.
                                  super__Optional_payload<KTXanimData,_true,_false,_false>.
                                  super__Optional_payload_base<KTXanimData>._M_payload._M_value.
                                  super_KVEntry + 8) + 4);
    }
    uVar2 = 0;
    local_40._M_dataplus._M_p._0_4_ = uVar1;
    PrintIndent::operator()
              (out,0,(char (*) [21])"{}    timescale: {}\n",&local_48,(uint *)&local_40);
    if (0xb < *(uint *)((long)&this->values[index].super__Optional_base<KTXanimData,_false,_false>.
                               _M_payload.super__Optional_payload<KTXanimData,_true,_false,_false>.
                               super__Optional_payload_base<KTXanimData>._M_payload + 0x10)) {
      uVar2 = *(undefined4 *)
               (*(char **)((long)&this->values[index].
                                  super__Optional_base<KTXanimData,_false,_false>._M_payload.
                                  super__Optional_payload<KTXanimData,_true,_false,_false>.
                                  super__Optional_payload_base<KTXanimData>._M_payload._M_value.
                                  super_KVEntry + 8) + 8);
    }
    local_40._M_dataplus._M_p._0_4_ = uVar2;
    PrintIndent::operator()
              (out,0,(char (*) [21])"{}    loopCount: {}\n",&local_48,(uint *)&local_40);
  }
  else {
    KVEntry::extractRawBytes_abi_cxx11_(&local_40,(KVEntry *)(this->values + index),true," ");
    PrintIndent::operator()(out,0,(char (*) [5])0x1d0d6d,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void printText(std::size_t index, PrintIndent& out, const char* prefix) const {
        values[index]->printText(out, prefix);
    }